

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# illegal_opcodes.c
# Opt level: O0

uint8_t absolute_RLA(cpu_registers *registers)

{
  uint16_t address_to_store_in;
  uint8_t local_11;
  cpu_registers *pcStack_10;
  uint8_t data;
  cpu_registers *registers_local;
  
  pcStack_10 = registers;
  local_11 = fetch_absolute(registers);
  base_rotate_left(pcStack_10,&local_11);
  address_to_store_in = calc_absolute_address(pcStack_10);
  base_store(address_to_store_in,&local_11);
  base_and(pcStack_10,local_11);
  return '\0';
}

Assistant:

uint8_t absolute_RLA(cpu_registers* registers) {
    uint8_t data = fetch_absolute(registers);
    base_rotate_left(registers, &data);
    base_store(calc_absolute_address(registers), &data);
    base_and(registers, data);
    return ZERO_EXTRA_CYCLES;
}